

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

void __thiscall
cmComputeLinkInformation::AddLibraryRuntimeInfo(cmComputeLinkInformation *this,string *fullPath)

{
  _Alloc_hider _Var1;
  cmMakefile *this_00;
  bool bVar2;
  char cVar3;
  long lVar4;
  string file;
  string soname;
  string local_b8;
  undefined1 local_98 [96];
  bool local_38;
  
  cmsys::SystemTools::GetFilenameName(&local_b8,fullPath);
  this_00 = this->Makefile;
  _Var1._M_p = local_98 + 0x10;
  local_98._0_8_ = _Var1._M_p;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,"CMAKE_PLATFORM_HAS_INSTALLNAME","");
  bVar2 = cmMakefile::IsOn(this_00,(string *)local_98);
  if ((pointer)local_98._0_8_ != _Var1._M_p) {
    operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
  }
  if (bVar2) {
    local_98._8_8_ = 0;
    local_98[0x10] = '\0';
    local_98._0_8_ = _Var1._M_p;
    bVar2 = cmSystemTools::GuessLibraryInstallName(fullPath,(string *)local_98);
    if (!bVar2) {
      if ((pointer)local_98._0_8_ != _Var1._M_p) {
        operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
      }
      goto LAB_0037eb30;
    }
    lVar4 = std::__cxx11::string::find(local_98,0x6e4f85,0);
    if ((pointer)local_98._0_8_ != _Var1._M_p) {
      operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
    }
    if (lVar4 == -1) goto LAB_0037eb30;
  }
  cVar3 = cmsys::RegularExpression::find
                    (&this->ExtractSharedLibraryName,local_b8._M_dataplus._M_p,
                     &(this->ExtractSharedLibraryName).regmatch);
  if ((!(bool)cVar3) && (this->ArchivesMayBeShared == true)) {
    bVar2 = cmsys::RegularExpression::find
                      (&this->ExtractStaticLibraryName,local_b8._M_dataplus._M_p,
                       &(this->ExtractStaticLibraryName).regmatch);
    cVar3 = (bool)cVar3 || bVar2;
  }
  if ((bool)cVar3 == false) {
    cmGlobalGenerator::SplitFrameworkPath
              ((optional<cmGlobalGenerator::FrameworkDescriptor> *)local_98,this->GlobalGenerator,
               fullPath,Strict);
    cVar3 = local_38;
    if (local_38 == true) {
      std::_Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>::_M_destroy
                ((_Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor> *)local_98);
    }
  }
  if (cVar3 != '\0') {
    cmOrderDirectories::AddRuntimeLibrary
              ((this->OrderRuntimeSearchPath)._M_t.
               super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
               .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl,fullPath,(char *)0x0
              );
    if (this->LinkWithRuntimePath == true) {
      cmOrderDirectories::AddRuntimeLibrary
                ((this->OrderLinkerSearchPath)._M_t.
                 super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
                 .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl,fullPath,
                 (char *)0x0);
    }
  }
LAB_0037eb30:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddLibraryRuntimeInfo(
  std::string const& fullPath)
{
  // Get the name of the library from the file name.
  bool is_shared_library = false;
  std::string file = cmSystemTools::GetFilenameName(fullPath);

  if (this->Makefile->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
    // Check that @rpath is part of the install name.
    // If it isn't, return.
    std::string soname;
    if (!cmSystemTools::GuessLibraryInstallName(fullPath, soname)) {
      return;
    }

    if (soname.find("@rpath") == std::string::npos) {
      return;
    }
  }

  is_shared_library = this->ExtractSharedLibraryName.find(file);

  if (!is_shared_library) {
    // On some platforms (AIX) a shared library may look static.
    if (this->ArchivesMayBeShared) {
      if (this->ExtractStaticLibraryName.find(file)) {
        // This is the name of a shared library or archive.
        is_shared_library = true;
      }
    }
  }

  // It could be an Apple framework
  if (!is_shared_library) {
    is_shared_library =
      this->GlobalGenerator
        ->SplitFrameworkPath(fullPath,
                             cmGlobalGenerator::FrameworkFormat::Strict)
        .has_value();
  }

  if (!is_shared_library) {
    return;
  }

  // Include this library in the runtime path ordering.
  this->OrderRuntimeSearchPath->AddRuntimeLibrary(fullPath);
  if (this->LinkWithRuntimePath) {
    this->OrderLinkerSearchPath->AddRuntimeLibrary(fullPath);
  }
}